

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O0

int uv__udp_disconnect(uv_udp_t *handle)

{
  int *piVar1;
  bool bVar2;
  undefined1 local_2c [8];
  sockaddr addr;
  int r;
  uv_udp_t *handle_local;
  
  unique0x100000d9 = handle;
  memset(local_2c,0,0x10);
  local_2c._0_2_ = 0;
  do {
    piVar1 = __errno_location();
    *piVar1 = 0;
    addr.sa_data._6_4_ = connect((stack0xffffffffffffffe8->io_watcher).fd,(sockaddr *)local_2c,0x10)
    ;
    bVar2 = false;
    if (addr.sa_data._6_4_ == -1) {
      piVar1 = __errno_location();
      bVar2 = *piVar1 == 4;
    }
  } while (bVar2);
  if ((addr.sa_data._6_4_ == -1) && (piVar1 = __errno_location(), *piVar1 != 0x61)) {
    piVar1 = __errno_location();
    return -*piVar1;
  }
  stack0xffffffffffffffe8->flags = stack0xffffffffffffffe8->flags & 0xfdffffff;
  return 0;
}

Assistant:

int uv__udp_disconnect(uv_udp_t* handle) {
    int r;
    struct sockaddr addr;

    memset(&addr, 0, sizeof(addr));

    addr.sa_family = AF_UNSPEC;

    do {
      errno = 0;
      r = connect(handle->io_watcher.fd, &addr, sizeof(addr));
    } while (r == -1 && errno == EINTR);

    if (r == -1 && errno != EAFNOSUPPORT)
      return UV__ERR(errno);

    handle->flags &= ~UV_HANDLE_UDP_CONNECTED;
    return 0;
}